

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.cpp
# Opt level: O0

void __thiscall
Diligent::SerializedPipelineStateImpl::Initialize<Diligent::ComputePipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,ComputePipelineStateCreateInfo *CreateInfo,
          PipelineStateArchiveInfo *ArchiveInfo)

{
  IPipelineResourceSignature *pObj;
  value_type pcVar1;
  undefined *puVar2;
  bool bVar3;
  ARCHIVE_DEVICE_DATA_FLAGS AVar4;
  PSO_ARCHIVE_FLAGS PVar5;
  ARCHIVE_DEVICE_DATA_FLAGS AVar6;
  int iVar7;
  undefined8 uVar8;
  Char *pCVar9;
  reference this_00;
  undefined4 extraout_var;
  reference ppcVar10;
  IMemoryAllocator *Allocator;
  ComputePipelineStateCreateInfo *Args_1;
  undefined1 local_188 [8];
  string msg_2;
  Serializer<(Diligent::SerializerMode)1> Ser_1;
  undefined1 local_130 [8];
  Serializer<(Diligent::SerializerMode)2> Ser;
  anon_class_24_3_3c7a8e98 SerializePsoCI;
  string msg_1;
  IPipelineResourceSignature *pSignature;
  undefined1 local_d0 [4];
  Uint32 i;
  TPRSNames PRSNames;
  IPipelineResourceSignature *DefaultSignatures [1];
  IPipelineResourceSignature **ppSignatures;
  undefined1 local_78 [4];
  Uint32 SignaturesCount;
  string _msg;
  undefined1 local_48 [8];
  string msg;
  type Flag;
  ARCHIVE_DEVICE_DATA_FLAGS DeviceBits;
  PipelineStateArchiveInfo *ArchiveInfo_local;
  ComputePipelineStateCreateInfo *CreateInfo_local;
  SerializedPipelineStateImpl *this_local;
  
  msg.field_2._12_4_ = ArchiveInfo->DeviceFlags;
  AVar4 = Diligent::operator&(msg.field_2._12_4_,ARCHIVE_DEVICE_DATA_FLAG_GL);
  if (AVar4 != ARCHIVE_DEVICE_DATA_FLAG_NONE) {
    AVar6 = ARCHIVE_DEVICE_DATA_FLAG_GLES;
    AVar4 = Diligent::operator&(msg.field_2._12_4_,ARCHIVE_DEVICE_DATA_FLAG_GLES);
    if (AVar4 != ARCHIVE_DEVICE_DATA_FLAG_NONE) {
      AVar4 = operator~((Diligent *)0x8,AVar6);
      operator&=((ARCHIVE_DEVICE_DATA_FLAGS *)(msg.field_2._M_local_buf + 0xc),AVar4);
    }
  }
  PVar5 = Diligent::operator&(ArchiveInfo->PSOFlags,PSO_ARCHIVE_FLAG_STRIP_REFLECTION);
  (this->m_Data).Aux.NoShaderReflection = PVar5 != PSO_ARCHIVE_FLAG_NONE;
  while (msg.field_2._12_4_ != 0) {
    msg.field_2._8_4_ =
         ExtractLSB<Diligent::ARCHIVE_DEVICE_DATA_FLAGS>
                   ((ARCHIVE_DEVICE_DATA_FLAGS *)(msg.field_2._M_local_buf + 0xc));
    switch(msg.field_2._8_4_) {
    case 0:
      FormatString<char[53]>
                ((string *)local_48,
                 (char (*) [53])"ARCHIVE_DEVICE_DATA_FLAG_NONE (0) should never occur");
      pCVar9 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar9,"Initialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
                 ,0xeb);
      std::__cxx11::string::~string((string *)local_48);
      break;
    default:
      FormatString<char[30]>((string *)local_78,(char (*) [30])"Unexpected render device type");
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar8 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar8,0);
      }
      std::__cxx11::string::~string((string *)local_78);
      break;
    case 4:
    case 8:
      PatchShadersGL<Diligent::ComputePipelineStateCreateInfo>(this,CreateInfo);
      break;
    case 0x10:
      PatchShadersVk<Diligent::ComputePipelineStateCreateInfo>(this,CreateInfo);
    }
  }
  bVar3 = SerializedData::operator_cast_to_bool(&(this->m_Data).Common);
  if (!bVar3) {
    if ((CreateInfo->super_PipelineStateCreateInfo).ResourceSignaturesCount == 0) {
      AVar4 = ArchiveInfo->DeviceFlags;
      AVar6 = Diligent::operator|(ARCHIVE_DEVICE_DATA_FLAG_GL,ARCHIVE_DEVICE_DATA_FLAG_GLES);
      AVar4 = Diligent::operator&(AVar4,AVar6);
      if (AVar4 != ARCHIVE_DEVICE_DATA_FLAG_NONE) {
        PrepareDefaultSignatureGL<Diligent::ComputePipelineStateCreateInfo>(this,CreateInfo);
      }
    }
    else {
      PVar5 = Diligent::operator&(ArchiveInfo->PSOFlags,PSO_ARCHIVE_FLAG_DO_NOT_PACK_SIGNATURES);
      (this->m_Data).DoNotPackSignatures = PVar5 != PSO_ARCHIVE_FLAG_NONE;
    }
    ppSignatures._4_4_ = (CreateInfo->super_PipelineStateCreateInfo).ResourceSignaturesCount;
    DefaultSignatures[0] =
         (IPipelineResourceSignature *)
         (CreateInfo->super_PipelineStateCreateInfo).ppResourceSignatures;
    memset(PRSNames._M_elems + 7,0,8);
    bVar3 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                      ((RefCntAutoPtr *)&this->m_pDefaultSignature);
    if (bVar3) {
      PRSNames._M_elems[7] =
           (char *)Diligent::RefCntAutoPtr::operator_cast_to_SerializedResourceSignatureImpl_
                             ((RefCntAutoPtr *)&this->m_pDefaultSignature);
      DefaultSignatures[0] = (IPipelineResourceSignature *)(PRSNames._M_elems + 7);
      ppSignatures._4_4_ = 1;
    }
    memset(local_d0,0,0x40);
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
    ::resize(&this->m_Signatures,(ulong)ppSignatures._4_4_);
    for (pSignature._4_4_ = 0; pSignature._4_4_ < ppSignatures._4_4_;
        pSignature._4_4_ = pSignature._4_4_ + 1) {
      pObj = (IPipelineResourceSignature *)
             DefaultSignatures[0][pSignature._4_4_].super_IDeviceObject.super_IObject._vptr_IObject;
      if (pObj == (IPipelineResourceSignature *)0x0) {
        FormatString<char[71]>
                  ((string *)&SerializePsoCI.this,
                   (char (*) [71])
                   "This error should\'ve been caught by ValidatePipelineResourceSignatures");
        pCVar9 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar9,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
                   ,0x116);
        std::__cxx11::string::~string((string *)&SerializePsoCI.this);
      }
      this_00 = std::
                vector<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>_>_>
                ::operator[](&this->m_Signatures,(ulong)pSignature._4_4_);
      RefCntAutoPtr<Diligent::IPipelineResourceSignature>::operator=(this_00,pObj);
      iVar7 = (*(pObj->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      pcVar1 = *(value_type *)CONCAT44(extraout_var,iVar7);
      ppcVar10 = std::array<const_char_*,_8UL>::operator[]
                           ((array<const_char_*,_8UL> *)local_d0,(ulong)pSignature._4_4_);
      *ppcVar10 = pcVar1;
    }
    Args_1 = (ComputePipelineStateCreateInfo *)local_d0;
    Ser.m_Ptr = (TPointer)CreateInfo;
    SerializePsoCI.CreateInfo = Args_1;
    SerializePsoCI.PRSNames = (TPRSNames *)this;
    Serializer<(Diligent::SerializerMode)2>::Serializer
              ((Serializer<(Diligent::SerializerMode)2> *)local_130);
    Initialize<Diligent::ComputePipelineStateCreateInfo>(Diligent::ComputePipelineStateCreateInfo_const&,Diligent::PipelineStateArchiveInfo_const&)
    ::{lambda(auto:1&)#1}::operator()
              ((_lambda_auto_1___1_ *)&Ser.m_Ptr,
               (Serializer<(Diligent::SerializerMode)2> *)local_130);
    Allocator = GetRawAllocator();
    Serializer<(Diligent::SerializerMode)2>::AllocateData
              ((SerializedData *)&Ser_1.m_Ptr,(Serializer<(Diligent::SerializerMode)2> *)local_130,
               Allocator);
    SerializedData::operator=(&(this->m_Data).Common,(SerializedData *)&Ser_1.m_Ptr);
    SerializedData::~SerializedData((SerializedData *)&Ser_1.m_Ptr);
    Serializer<(Diligent::SerializerMode)1>::Serializer
              ((Serializer<(Diligent::SerializerMode)1> *)((long)&msg_2.field_2 + 8),
               &(this->m_Data).Common);
    Initialize<Diligent::ComputePipelineStateCreateInfo>(Diligent::ComputePipelineStateCreateInfo_const&,Diligent::PipelineStateArchiveInfo_const&)
    ::{lambda(auto:1&)#1}::operator()
              ((_lambda_auto_1___1_ *)&Ser.m_Ptr,
               (Serializer<(Diligent::SerializerMode)1> *)((long)&msg_2.field_2 + 8));
    bVar3 = Serializer<(Diligent::SerializerMode)1>::IsEnded
                      ((Serializer<(Diligent::SerializerMode)1> *)((long)&msg_2.field_2 + 8));
    if (!bVar3) {
      FormatString<char[26],char[14]>
                ((string *)local_188,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])0xe2f9f7,(char (*) [14])Args_1);
      pCVar9 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar9,"Initialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
                 ,299);
      std::__cxx11::string::~string((string *)local_188);
    }
  }
  std::atomic<Diligent::PIPELINE_STATE_STATUS>::store
            (&this->m_Status,PIPELINE_STATE_STATUS_READY,memory_order_seq_cst);
  return;
}

Assistant:

void SerializedPipelineStateImpl::Initialize(const PSOCreateInfoType&        CreateInfo,
                                             const PipelineStateArchiveInfo& ArchiveInfo)
{
    auto DeviceBits = ArchiveInfo.DeviceFlags;
    if ((DeviceBits & ARCHIVE_DEVICE_DATA_FLAG_GL) != 0 && (DeviceBits & ARCHIVE_DEVICE_DATA_FLAG_GLES) != 0)
    {
        // OpenGL and GLES use the same device data. Clear one flag to avoid shader duplication.
        DeviceBits &= ~ARCHIVE_DEVICE_DATA_FLAG_GLES;
    }

    m_Data.Aux.NoShaderReflection = (ArchiveInfo.PSOFlags & PSO_ARCHIVE_FLAG_STRIP_REFLECTION) != 0;
    while (DeviceBits != 0)
    {
        const auto Flag = ExtractLSB(DeviceBits);

        static_assert(ARCHIVE_DEVICE_DATA_FLAG_LAST == 1 << 7, "Please update the switch below to handle the new data type");
        switch (Flag)
        {
#if D3D11_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_D3D11:
                PatchShadersD3D11(CreateInfo);
                break;
#endif
#if D3D12_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_D3D12:
                PatchShadersD3D12(CreateInfo);
                break;
#endif
#if GL_SUPPORTED || GLES_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_GL:
            case ARCHIVE_DEVICE_DATA_FLAG_GLES:
                PatchShadersGL(CreateInfo);
                break;
#endif
#if VULKAN_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_VULKAN:
                PatchShadersVk(CreateInfo);
                break;
#endif
#if METAL_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_METAL_MACOS:
            case ARCHIVE_DEVICE_DATA_FLAG_METAL_IOS:
                PatchShadersMtl(CreateInfo, ArchiveDeviceDataFlagToArchiveDeviceType(Flag),
                                GetPSODumpFolder(m_pSerializationDevice->GetMtlProperties().DumpFolder, GetDesc(), Flag));
                break;
#endif
#if WEBGPU_SUPPORTED
            case ARCHIVE_DEVICE_DATA_FLAG_WEBGPU:
                PatchShadersWebGPU(CreateInfo);
                break;
#endif
            case ARCHIVE_DEVICE_DATA_FLAG_NONE:
                UNEXPECTED("ARCHIVE_DEVICE_DATA_FLAG_NONE (0) should never occur");
                break;

            default:
                LOG_ERROR_MESSAGE("Unexpected render device type");
                break;
        }
    }

    if (!m_Data.Common)
    {
        if (CreateInfo.ResourceSignaturesCount == 0)
        {
#if GL_SUPPORTED || GLES_SUPPORTED
            if (ArchiveInfo.DeviceFlags & (ARCHIVE_DEVICE_DATA_FLAG_GL | ARCHIVE_DEVICE_DATA_FLAG_GLES))
            {
                // We must add empty device signature for OpenGL after all other devices are processed,
                // otherwise this empty description will be used as common signature description.
                PrepareDefaultSignatureGL(CreateInfo);
            }
#endif
        }
        else
        {
            m_Data.DoNotPackSignatures = (ArchiveInfo.PSOFlags & PSO_ARCHIVE_FLAG_DO_NOT_PACK_SIGNATURES) != 0;
        }

        auto   SignaturesCount = CreateInfo.ResourceSignaturesCount;
        auto** ppSignatures    = CreateInfo.ppResourceSignatures;

        IPipelineResourceSignature* DefaultSignatures[1] = {};
        if (m_pDefaultSignature)
        {
            DefaultSignatures[0] = m_pDefaultSignature;
            ppSignatures         = DefaultSignatures;
            SignaturesCount      = 1;
        }

        TPRSNames PRSNames = {};
        m_Signatures.resize(SignaturesCount);
        for (Uint32 i = 0; i < SignaturesCount; ++i)
        {
            auto* pSignature = ppSignatures[i];
            VERIFY(pSignature != nullptr, "This error should've been caught by ValidatePipelineResourceSignatures");
            m_Signatures[i] = pSignature;
            PRSNames[i]     = pSignature->GetDesc().Name;
        }

        auto SerializePsoCI = [&](auto& Ser) //
        {
            SerializePSOCreateInfo(Ser, CreateInfo, PRSNames);
            constexpr auto SerMode = std::remove_reference<decltype(Ser)>::type::GetMode();
            PSOSerializer<SerMode>::SerializeAuxData(Ser, m_Data.Aux, nullptr);
        };

        {
            Serializer<SerializerMode::Measure> Ser;
            SerializePsoCI(Ser);
            m_Data.Common = Ser.AllocateData(GetRawAllocator());
        }

        {
            Serializer<SerializerMode::Write> Ser{m_Data.Common};
            SerializePsoCI(Ser);
            VERIFY_EXPR(Ser.IsEnded());
        }
    }

    m_Status.store(PIPELINE_STATE_STATUS_READY);
}